

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  anon_struct_72_9_80492c42 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  ulong local_1c8;
  sysbvm_tuple_t local_1b8;
  sysbvm_tuple_t sStack_1b0;
  sysbvm_tuple_t local_1a8;
  sysbvm_tuple_t sStack_1a0;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t sStack_190;
  sysbvm_tuple_t local_188;
  sysbvm_tuple_t sStack_180;
  sysbvm_tuple_t local_178;
  ulong local_168;
  sysbvm_stackFrameRecord_t local_160;
  undefined8 local_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  sysbvm_tuple_t *psStack_130;
  sysbvm_stackFrameRecord_t local_128 [15];
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  sStack_190 = 0;
  local_1a8 = 0;
  sStack_1a0 = 0;
  sStack_1b0 = 0;
  local_178 = 0;
  local_1b8 = arguments[1];
  memset(local_128,0,0xf8);
  local_128[0].type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  sysbvm_stackFrame_pushRecord(local_128);
  local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_148._12_4_ = 0;
  local_138 = 9;
  psStack_130 = &local_1b8;
  sysbvm_stackFrame_pushRecord(&local_148);
  local_1c8 = 0;
  local_160.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_160.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_150 = *(undefined8 *)(local_1b8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_160);
  sStack_1b0 = sysbvm_functionActivationEnvironment_createForDependentFunctionType
                         (context,0,*arguments);
  uVar5 = *(ulong *)(*arguments + 0x108);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    local_1c8 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  uVar5 = *(ulong *)(*arguments + 0xf8);
  if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
    uVar5 = (long)uVar5 >> 4;
  }
  else {
    uVar5 = *(ulong *)(uVar5 + 0x10);
  }
  if (((uVar5 & 2) != 0) && (local_1c8 == 0)) {
    sysbvm_error("Variadic functions at least one extra argument node.");
  }
  uVar2 = (ulong)(((uint)uVar5 & 2) >> 1);
  uVar6 = *(ulong *)(local_1b8 + 0x30);
  if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
    uVar6 = (ulong)(*(uint *)(uVar6 + 0xc) >> 3);
  }
  else {
    uVar6 = 0;
  }
  local_168 = uVar5;
  sStack_180 = sysbvm_array_create(context,uVar6);
  if (local_1c8 == uVar2) {
    uVar5 = 0;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      uVar1 = *(ulong *)(*arguments + 0x108);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_1a8 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + lVar4 * 8);
      }
      else {
        local_1a8 = 0;
      }
      if (((local_1c8 & 0xf) == 0 && local_1c8 != 0) && (*(long *)(local_1c8 + 0x28) == 0x1f)) {
        sysbvm_error("TODO: Support forall argument types");
      }
      else {
        if (uVar6 <= uVar5) {
          sysbvm_error("Function application is missing required arguments.");
        }
        uVar1 = *(ulong *)(local_1b8 + 0x30);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          sStack_1a0 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
        }
        else {
          sStack_1a0 = 0;
        }
        local_178 = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
                              (context,local_1a8,&sStack_1b0);
        local_188 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                              (context,sStack_1a0,local_178,arguments[2]);
        if ((sStack_180 & 0xf) == 0 && sStack_180 != 0) {
          *(sysbvm_tuple_t *)(sStack_180 + 0x10 + uVar5 * 8) = local_188;
        }
        local_198 = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
                              (context,local_188);
        uVar1 = *(ulong *)(sStack_1b0 + 0xa0);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          *(sysbvm_tuple_t *)(uVar1 + 0x10 + lVar4 * 8) = local_198;
        }
        uVar5 = uVar5 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (local_1c8 - uVar2 != lVar4);
  }
  if (((local_168 & 2) == 0) && (uVar5 != uVar6)) {
    sysbvm_error("Function application is not receiving the expected number of arguments.");
  }
  if (uVar5 < uVar6) {
    do {
      uVar2 = *(ulong *)(local_1b8 + 0x30);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        sStack_1a0 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar5 * 8);
      }
      else {
        sStack_1a0 = 0;
      }
      local_188 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,sStack_1a0,0,arguments[2]);
      if ((sStack_180 & 0xf) == 0 && sStack_180 != 0) {
        *(sysbvm_tuple_t *)(sStack_180 + 0x10 + uVar5 * 8) = local_188;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  *(sysbvm_tuple_t *)(local_1b8 + 0x30) = sStack_180;
  if (*(sysbvm_tuple_t *)(*arguments + 0x110) != 0) {
    sStack_190 = sysbvm_interpreter_evaluateASTWithEnvironment
                           (context,*(sysbvm_tuple_t *)(*arguments + 0x110),sStack_1b0);
  }
  sStack_190 = sysbvm_type_canonicalizeDependentResultType(context,sStack_190);
  uVar5 = *(ulong *)(local_1b8 + 0x38);
  if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
    lVar4 = (long)uVar5 >> 4;
  }
  else {
    lVar4 = *(long *)(uVar5 + 0x10);
  }
  *(ulong *)(local_1b8 + 0x38) = lVar4 << 4 | 0x3b;
  *(sysbvm_tuple_t *)(local_1b8 + 0x20) = sStack_190;
  sysbvm_stackFrame_popRecord(&local_160);
  sysbvm_stackFrame_popRecord(&local_148);
  sysbvm_stackFrame_popRecord(local_128);
  sVar3 = sysbvm_astFunctionApplicationNode_optimizePureApplication
                    (context,(sysbvm_astFunctionApplicationNode_t **)(arguments + 1));
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_dependentFunctionType_t **dependentFunctionType = (sysbvm_dependentFunctionType_t **)&arguments[0];
    sysbvm_tuple_t *node = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_astFunctionApplicationNode_t *functionApplicationNode;

        sysbvm_tuple_t applicationEnvironment;
        sysbvm_tuple_t argumentNode;

        sysbvm_tuple_t applicationArgumentNode;
        sysbvm_tuple_t applicationArgumentValue;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {
        .functionApplicationNode = (sysbvm_astFunctionApplicationNode_t*)*node,
    };

    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord); 
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.functionApplicationNode->super.sourcePosition);

    gcFrame.applicationEnvironment = sysbvm_functionActivationEnvironment_createForDependentFunctionType(context, SYSBVM_NULL_TUPLE, (sysbvm_tuple_t)*dependentFunctionType);

    size_t argumentNodeCount = sysbvm_array_getSize((*dependentFunctionType)->argumentNodes);
    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*dependentFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    if(isVariadic && argumentNodeCount == 0)
        sysbvm_error("Variadic functions at least one extra argument node.");
    
    size_t directEvaluationArgumentNodeCount = isVariadic ? argumentNodeCount - 1 : argumentNodeCount;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.functionApplicationNode->arguments);
    size_t sourceArgumentIndex = 0;

    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < directEvaluationArgumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*dependentFunctionType)->argumentNodes, i);
        if(sysbvm_astArgumentNode_isForAll(argumentNodeCount))
        {
            sysbvm_error("TODO: Support forall argument types");
        }
        else
        {
            if(sourceArgumentIndex >= applicationArgumentCount)
                sysbvm_error("Function application is missing required arguments.");

            gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, sourceArgumentIndex);
            gcFrame.expectedArgumentType = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(context, gcFrame.argumentNode, &gcFrame.applicationEnvironment);
            gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, gcFrame.expectedArgumentType, *environment);
            sysbvm_array_atPut(gcFrame.analyzedArguments, sourceArgumentIndex, gcFrame.analyzedArgument);
            gcFrame.applicationArgumentValue = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(context, gcFrame.analyzedArgument);
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &gcFrame.applicationEnvironment, gcFrame.applicationArgumentValue);
            ++sourceArgumentIndex;
        }
    }

    if(!isVariadic && sourceArgumentIndex != applicationArgumentCount)
        sysbvm_error("Function application is not receiving the expected number of arguments.");

    for(size_t i = sourceArgumentIndex; i < applicationArgumentCount; ++i)
    {
        gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.functionApplicationNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    gcFrame.functionApplicationNode->arguments = gcFrame.analyzedArguments;

    if((*dependentFunctionType)->resultTypeNode)
        gcFrame.resultType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*dependentFunctionType)->resultTypeNode, gcFrame.applicationEnvironment);
    gcFrame.resultType = sysbvm_type_canonicalizeDependentResultType(context, gcFrame.resultType);
    gcFrame.functionApplicationNode->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(gcFrame.functionApplicationNode->applicationFlags)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    gcFrame.functionApplicationNode->super.analyzedType = gcFrame.resultType;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, (sysbvm_astFunctionApplicationNode_t**)node);
}